

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  uint *puVar1;
  byte bVar2;
  uint8_t uVar3;
  ushort uVar4;
  en_ptls_state_t eVar5;
  ptls_hpke_cipher_suite_t *ppVar6;
  st_ptls_ech_create_opener_t *psVar7;
  st_ptls_aead_context_t *psVar8;
  uint8_t *puVar9;
  char *pcVar10;
  st_ptls_on_client_hello_t *psVar11;
  ushort *puVar12;
  ptls_key_exchange_algorithm_t **pppVar13;
  ptls_buffer_t *ppVar14;
  size_t sVar15;
  st_ptls_update_traffic_key_t *psVar16;
  size_t sVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ptls_iovec_t pVar21;
  ptls_iovec_t ikm;
  ptls_iovec_t pVar22;
  bool bVar23;
  bool bVar24;
  byte bVar25;
  int iVar26;
  int iVar27;
  st_ptls_client_hello_t *ch;
  ptls_aead_context_t *ppVar28;
  uint8_t *puVar29;
  void *__dest;
  size_t sVar30;
  size_t sVar31;
  ptls_key_schedule_t *ppVar32;
  ulong uVar33;
  ptls_buffer_t *ppVar34;
  size_t sVar35;
  uint8_t *puVar36;
  size_t sVar37;
  byte bVar38;
  size_t sVar39;
  size_t sVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  ptls_key_exchange_algorithm_t *ppVar44;
  ptls_hash_context_t **pppVar45;
  size_t sVar46;
  st_ptls_client_hello_t *psVar47;
  uint uVar48;
  ptls_context_t *ppVar49;
  size_t sVar50;
  size_t sVar51;
  ptls_iovec_t *ppVar52;
  int iVar53;
  ptls_iovec_t tbs;
  ptls_iovec_t raw_message;
  ptls_iovec_t raw_message_00;
  ptls_iovec_t ch_trunc;
  ptls_iovec_t message_00;
  ptls_iovec_t message_01;
  ptls_message_emitter_t *_emitter;
  size_t tbs_start;
  int accept_early_data;
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t pubkey;
  anon_struct_24_2_cc7b932a key_share;
  size_t psk_index;
  ptls_cipher_suite_t *cs;
  undefined4 in_stack_fffffffffffff4a8;
  undefined4 in_stack_fffffffffffff4ac;
  ptls_t *tls_cbarg;
  size_t local_b18;
  uint8_t *local_b10;
  uint8_t *local_b08;
  size_t local_b00;
  int local_abc;
  ptls_iovec_t local_ab8;
  ptls_iovec_t local_aa8;
  ptls_key_exchange_algorithm_t *local_a98;
  ptls_iovec_t pStack_a90;
  size_t local_a78;
  size_t local_a70;
  uint8_t *local_a68;
  void *pvStack_a60;
  ptls_buffer_t local_a58;
  ptls_buffer_t *local_a38;
  size_t local_a30;
  char *local_a28;
  undefined8 uStack_a20;
  ptls_on_client_hello_parameters_t local_a18;
  undefined1 local_990 [784];
  undefined1 local_680 [416];
  undefined1 local_4e0 [784];
  undefined1 local_1d0 [416];
  
  local_b10 = (uint8_t *)message.len;
  local_b08 = message.base;
  local_a98 = (ptls_key_exchange_algorithm_t *)0x0;
  pStack_a90.base = (uint8_t *)0x0;
  pStack_a90.len = 0;
  local_a58.off = 0;
  local_a58.is_allocated = '\0';
  local_a58.align_bits = '\0';
  local_a58._26_6_ = 0;
  local_a58.capacity = 0;
  local_a68 = (uint8_t *)0x0;
  pvStack_a60 = (void *)0x0;
  local_a70 = 0xffffffffffffffff;
  local_aa8.base = (uint8_t *)0x0;
  local_aa8.len = 0;
  local_ab8.base = (uint8_t *)0x0;
  local_ab8.len = 0;
  local_abc = 0;
  eVar5 = tls->state;
  local_a58.base = "";
  ch = (st_ptls_client_hello_t *)malloc(0x4b0);
  local_a58.capacity = 0;
  local_a58.off = 0;
  local_a58._24_8_ = local_a58._24_8_ & 0xffffffffffff0000;
  if (ch == (st_ptls_client_hello_t *)0x0) {
LAB_00120659:
    iVar26 = 0x201;
    goto LAB_0012065f;
  }
  memset(local_4e0,0,0x4b0);
  memcpy(local_1d0,&DAT_001315f8,0x198);
  memcpy(ch,local_4e0,0x4b0);
  puVar36 = local_b08 + 4;
  iVar26 = decode_client_hello(tls->ctx,ch,puVar36,local_b08 + (long)local_b10,properties,tls);
  if (iVar26 != 0) goto LAB_0012065f;
  psVar47 = (st_ptls_client_hello_t *)0x0;
  if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    psVar47 = (st_ptls_client_hello_t *)tls->client_random;
  }
  raw_message.len = (size_t)tls;
  raw_message.base = local_b10;
  iVar26 = check_client_hello_constraints
                     ((ptls_context_t *)ch,psVar47,(void *)0x0,(int)message.base,raw_message,
                      (ptls_t *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8));
  if (iVar26 != 0) goto LAB_0012065f;
  if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    if ((tls->ech).aead != (ptls_aead_context_t *)0x0) {
      if ((ch->ech).payload.base == (uint8_t *)0x0) {
        iVar26 = 0x6d;
        goto LAB_0012065f;
      }
      if (((ch->ech).config_id != (tls->ech).config_id) ||
         (ppVar6 = (tls->ech).cipher, (ch->ech).cipher_suite.kdf != (ppVar6->id).kdf)) {
        iVar26 = 0x2f;
        goto LAB_0012065f;
      }
      iVar26 = 0x2f;
      if (((ch->ech).cipher_suite.aead != (ppVar6->id).aead) || ((ch->ech).enc.len != 0))
      goto LAB_0012065f;
    }
  }
  else {
    puVar29 = ch->random_bytes;
    uVar18 = *(undefined8 *)puVar29;
    uVar19 = *(undefined8 *)(puVar29 + 8);
    uVar20 = *(undefined8 *)(puVar29 + 0x18);
    *(undefined8 *)(tls->client_random + 0x10) = *(undefined8 *)(puVar29 + 0x10);
    *(undefined8 *)(tls->client_random + 0x18) = uVar20;
    *(undefined8 *)tls->client_random = uVar18;
    *(undefined8 *)(tls->client_random + 8) = uVar19;
    log_client_random(tls);
  }
  if ((ch->ech).payload.base == (uint8_t *)0x0) {
    if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x1) !=
        (undefined1  [112])0x0) {
      iVar26 = 0x2f;
      if (eVar5 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
        __assert_fail("is_second_flight",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0x1162,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      goto LAB_0012065f;
    }
  }
  else {
    iVar26 = 0x2f;
    if ((ch->ech).type != '\0') goto LAB_0012065f;
    if (eVar5 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
      *(byte *)&tls->ech = *(byte *)&tls->ech | 1;
      psVar7 = (tls->ctx->ech).server.create_opener;
      if (psVar7 != (st_ptls_ech_create_opener_t *)0x0) {
        local_a28 = "tls ech";
        uStack_a20 = 8;
        pVar21.len = 8;
        pVar21.base = (uint8_t *)"tls ech";
        ppVar28 = (*psVar7->cb)(psVar7,&(tls->ech).kem,&(tls->ech).cipher,tls,(ch->ech).config_id,
                                (ch->ech).cipher_suite,(ch->ech).enc,pVar21);
        (tls->ech).aead = ppVar28;
        if (ppVar28 != (ptls_aead_context_t *)0x0) {
          (tls->ech).config_id = (ch->ech).config_id;
        }
      }
      if (server_handle_hello::logpoint.state.generation != ptls_log._generation) {
        server_handle_hello_cold_1();
      }
      if (server_handle_hello::logpoint.state.active_conns != 0) {
        server_handle_hello_cold_2();
      }
    }
    psVar8 = (tls->ech).aead;
    if (psVar8 != (st_ptls_aead_context_t *)0x0) {
      sVar31 = (ch->ech).payload.len;
      puVar29 = (uint8_t *)malloc(sVar31 - psVar8->algo->tag_size);
      local_a68 = puVar29;
      if (puVar29 != (uint8_t *)0x0) {
        tls_cbarg = (ptls_t *)(local_b10 + -4);
        __dest = malloc((size_t)tls_cbarg);
        pvStack_a60 = __dest;
        if (__dest != (void *)0x0) {
          memcpy(__dest,puVar36,(size_t)tls_cbarg);
          puVar9 = (ch->ech).payload.base;
          memset((void *)(((long)puVar9 - (long)puVar36) + (long)__dest),0,sVar31);
          sVar30 = (*psVar8->do_decrypt)
                             (psVar8,puVar29,puVar9,sVar31,
                              (ulong)(eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO),__dest,
                              (size_t)tls_cbarg);
          if (sVar30 == 0xffffffffffffffff) {
            iVar26 = 0x33;
            if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) goto LAB_0012065f;
            psVar8 = (tls->ech).aead;
            (*psVar8->dispose_crypto)(psVar8);
            free(psVar8);
            (tls->ech).aead = (ptls_aead_context_t *)0x0;
          }
          else {
            *(byte *)&tls->ech = *(byte *)&tls->ech | 4;
            iVar26 = rebuild_ch_inner(&local_a58,puVar29,
                                      puVar29 + ((ch->ech).payload.len -
                                                ((tls->ech).aead)->algo->tag_size),ch,
                                      puVar36 + ch->first_extension_at,local_b08 + (long)local_b10);
            local_b10 = (uint8_t *)local_a58.off;
            local_b08 = local_a58.base;
            if (iVar26 != 0) goto LAB_0012065f;
            memset(local_990,0,0x4b0);
            memcpy(local_680,&DAT_001315f8,0x198);
            memcpy(ch,local_990,0x4b0);
            iVar26 = decode_client_hello(tls->ctx,ch,local_b08 + 4,local_b10 + (long)local_b08,
                                         properties,tls);
            if (iVar26 != 0) goto LAB_0012065f;
            puVar36 = (tls->ech).inner_client_random;
            psVar47 = (st_ptls_client_hello_t *)0x0;
            if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
              psVar47 = (st_ptls_client_hello_t *)puVar36;
            }
            raw_message_00.len = (size_t)tls;
            raw_message_00.base = local_b10;
            iVar26 = check_client_hello_constraints
                               ((ptls_context_t *)ch,psVar47,(void *)0x1,(int)local_b08,
                                raw_message_00,tls_cbarg);
            if (iVar26 != 0) goto LAB_0012065f;
            if (eVar5 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
              puVar29 = ch->random_bytes;
              uVar18 = *(undefined8 *)puVar29;
              uVar19 = *(undefined8 *)(puVar29 + 8);
              uVar20 = *(undefined8 *)(puVar29 + 0x18);
              *(undefined8 *)((tls->ech).inner_client_random + 0x10) =
                   *(undefined8 *)(puVar29 + 0x10);
              *(undefined8 *)((tls->ech).inner_client_random + 0x18) = uVar20;
              *(undefined8 *)puVar36 = uVar18;
              *(undefined8 *)((tls->ech).inner_client_random + 8) = uVar19;
            }
          }
          goto LAB_00120361;
        }
      }
      iVar26 = 0x201;
      goto LAB_0012065f;
    }
  }
LAB_00120361:
  ppVar49 = tls->ctx;
  if ((ppVar49->field_0xb8 & 1) != 0) {
    puVar1 = &(ch->psk).ke_modes;
    *(byte *)puVar1 = (byte)*puVar1 & 0xfe;
  }
  if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    iVar26 = 0x32;
    if (((ch->psk).field_0xb4 & 1) != 0) goto LAB_0012065f;
    pcVar10 = tls->server_name;
    if (pcVar10 != (char *)0x0) {
      sVar31 = strlen(pcVar10);
      iVar26 = 0x28;
      if (((ch->server_name).len != sVar31) ||
         (iVar27 = bcmp((ch->server_name).base,pcVar10,sVar31), iVar27 != 0)) goto LAB_0012065f;
    }
  }
  else {
    if ((ch->legacy_session_id).len != 0) {
      tls->field_0x1e8 = tls->field_0x1e8 | 4;
    }
    ppVar44 = (ptls_key_exchange_algorithm_t *)(ch->server_name).base;
    if (ppVar44 == (ptls_key_exchange_algorithm_t *)0x0) {
      sVar30 = 0;
    }
    else {
      sVar30 = (ch->server_name).len;
    }
    sVar50 = (ch->server_certificate_types).count;
    psVar11 = ppVar49->on_client_hello;
    if (psVar11 != (st_ptls_on_client_hello_t *)0x0) {
      local_a18.negotiated_protocols.list = (ch->alpn).list;
      local_a18.raw_message.base = local_b08;
      local_a18.raw_message.len = (size_t)local_b10;
      local_a18.cipher_suites.base = (ch->cipher_suites).base;
      local_a18.cipher_suites.len = (ch->cipher_suites).len;
      local_a18.negotiated_protocols.count = (ch->alpn).count;
      local_a18.signature_algorithms.list = (ch->signature_algorithms).list;
      local_a18.signature_algorithms.count = (ch->signature_algorithms).count;
      local_a18.certificate_compression_algorithms.list = (ch->cert_compression_algos).list;
      local_a18.certificate_compression_algorithms.count = (ch->cert_compression_algos).count;
      local_a18.psk_identities.list = (ch->psk).identities.list;
      local_a18.psk_identities.count = (ch->psk).identities.count;
      local_a18._128_1_ = 0;
      local_a18.server_name.base = (uint8_t *)ppVar44;
      local_a18.server_name.len = sVar30;
      local_a18.server_certificate_types.list = (ch->server_certificate_types).list;
      local_a18.server_certificate_types.count = sVar50;
      iVar26 = (*psVar11->cb)(psVar11,tls,&local_a18);
      if (iVar26 != 0) goto LAB_0012065f;
      sVar50 = (ch->server_certificate_types).count;
      ppVar49 = tls->ctx;
    }
    bVar38 = (byte)ppVar49->field_0xb8 >> 4 & 2;
    if ((sVar50 != 0) || (bVar38 != 0)) {
      if (sVar50 == 0) {
        iVar26 = 0x2b;
        goto LAB_0012065f;
      }
      if ((ch->server_certificate_types).list[0] != bVar38) {
        lVar43 = 0;
        do {
          lVar42 = lVar43;
          if (sVar50 - 1 == lVar42) break;
          lVar43 = lVar42 + 1;
        } while ((ch->server_certificate_types).list[lVar42 + 1] != bVar38);
        iVar26 = 0x2b;
        if (sVar50 <= lVar42 + 1U) goto LAB_0012065f;
      }
    }
  }
  puVar36 = (ch->cipher_suites).base;
  bVar38 = (byte)ppVar49->field_0xb8 >> 7;
  uVar48 = (uint)bVar38;
  iVar26 = select_cipher((ptls_cipher_suite_t **)&local_a18,ppVar49->cipher_suites,puVar36,
                         puVar36 + (ch->cipher_suites).len,(byte)ppVar49->field_0xb8 >> 6 & 1,
                         (uint)bVar38,(ppVar49->pre_shared_key).hash);
  if (iVar26 != 0) goto LAB_0012065f;
  if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    iVar26 = 0x28;
    if ((ptls_key_exchange_algorithm_t *)tls->cipher_suite !=
        (ptls_key_exchange_algorithm_t *)local_a18.server_name.base) goto LAB_0012065f;
  }
  else {
    tls->cipher_suite = (ptls_cipher_suite_t *)local_a18.server_name.base;
    ppVar32 = key_schedule_new((ptls_cipher_suite_t *)local_a18.server_name.base,
                               (ptls_cipher_suite_t **)0x0,0);
    tls->key_schedule = ppVar32;
    if (ppVar32 == (ptls_key_schedule_t *)0x0) goto LAB_00120659;
  }
  puVar12 = (ushort *)(ch->key_shares).base;
  if ((puVar12 != (ushort *)0x0) &&
     (pppVar13 = tls->ctx->key_exchanges, pppVar13 != (ptls_key_exchange_algorithm_t **)0x0)) {
    uVar41 = (ch->key_shares).len;
    if (1 < uVar41) {
      uVar33 = (ulong)(ushort)(*puVar12 << 8 | *puVar12 >> 8);
      local_a18.server_name.base = (uint8_t *)(puVar12 + 1);
      if (uVar33 <= uVar41 - 2) {
        ppVar44 = (ptls_key_exchange_algorithm_t *)((long)puVar12 + uVar33 + 2);
        iVar26 = select_key_share(&local_a98,&pStack_a90,pppVar13,(uint8_t **)&local_a18,
                                  (uint8_t *)ppVar44,uVar48);
        if (((iVar26 != 0) ||
            (iVar26 = 0x32, (ptls_key_exchange_algorithm_t *)local_a18.server_name.base != ppVar44))
           || (iVar26 = 0x32,
              (ptls_key_exchange_algorithm_t *)local_a18.server_name.base !=
              (ptls_key_exchange_algorithm_t *)((long)puVar12 + uVar41))) goto LAB_0012065f;
        goto LAB_00120763;
      }
    }
    iVar26 = 0x32;
    goto LAB_0012065f;
  }
LAB_00120763:
  ppVar44 = local_a98;
  iVar27 = 1;
  if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    bVar23 = false;
  }
  else if (local_a98 == (ptls_key_exchange_algorithm_t *)0x0 || (ch->cookie).all.len == 0) {
    iVar27 = 0;
    bVar24 = true;
    bVar23 = true;
    if (((ch->key_shares).base != (uint8_t *)0x0) &&
       (pppVar13 = tls->ctx->key_exchanges, bVar23 = bVar24,
       pppVar13 != (ptls_key_exchange_algorithm_t **)0x0)) {
      if (local_a98 == (ptls_key_exchange_algorithm_t *)0x0) {
LAB_00120f4a:
        puVar36 = (ch->negotiated_groups).base;
        if (puVar36 == (uint8_t *)0x0) {
          iVar26 = 0x6d;
        }
        else {
          iVar26 = select_negotiated_group
                             ((ptls_key_exchange_algorithm_t **)&local_a18,pppVar13,puVar36,
                              puVar36 + (ch->negotiated_groups).len);
          if (iVar26 == 0) {
            ppVar32 = tls->key_schedule;
            if (ppVar32->num_hashes != 0) {
              pppVar45 = &ppVar32->hashes[0].ctx;
              sVar30 = 0;
              do {
                (*(*pppVar45)->update)(*pppVar45,local_b08,(size_t)local_b10);
                sVar30 = sVar30 + 1;
                pppVar45 = pppVar45 + 3;
              } while (sVar30 != ppVar32->num_hashes);
              ppVar32 = tls->key_schedule;
            }
            if (ppVar32->generation != 0) {
              __assert_fail("tls->key_schedule->generation == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                            ,0x11d5,
                            "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                           );
            }
            if (((properties == (ptls_handshake_properties_t *)0x0) ||
                ((*(byte *)((long)&properties->field_0 + 0x60) & 2) == 0)) ||
               (bVar23 = true,
               (undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x4) !=
               (undefined1  [112])0x0)) {
              key_schedule_transform_post_ch1hash(ppVar32);
              key_schedule_extract(tls->key_schedule,(tls->ctx->pre_shared_key).secret);
              bVar23 = false;
            }
            iVar26 = (*emitter->begin_message)(emitter);
            if (iVar26 == 0) {
              ppVar34 = emitter->buf;
              iVar26 = ptls_buffer_reserve_aligned(ppVar34,1,'\0');
              if (iVar26 == 0) {
                ppVar34->base[ppVar34->off] = '\x02';
                ppVar34->off = ppVar34->off + 1;
                iVar26 = ptls_buffer_reserve_aligned(ppVar34,3,'\0');
                if (iVar26 == 0) {
                  puVar36 = ppVar34->base;
                  sVar30 = ppVar34->off;
                  puVar36[sVar30 + 2] = '\0';
                  puVar36 = puVar36 + sVar30;
                  puVar36[0] = '\0';
                  puVar36[1] = '\0';
                  sVar30 = ppVar34->off;
                  ppVar34->off = sVar30 + 3;
                  ppVar14 = emitter->buf;
                  sVar50 = ppVar14->off;
                  iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                  if (iVar26 == 0) {
                    puVar36 = ppVar14->base;
                    sVar51 = ppVar14->off;
                    (puVar36 + sVar51)[0] = '\x03';
                    (puVar36 + sVar51)[1] = '\x03';
                    ppVar14->off = ppVar14->off + 2;
                    iVar26 = ptls_buffer_reserve_aligned(emitter->buf,0x20,'\0');
                    if (iVar26 == 0) {
                      puVar36 = emitter->buf->base;
                      sVar51 = emitter->buf->off;
                      puVar29 = puVar36 + sVar51 + 0x10;
                      puVar29[0] = 0xc2;
                      puVar29[1] = 0xa2;
                      puVar29[2] = '\x11';
                      puVar29[3] = '\x16';
                      puVar29[4] = 'z';
                      puVar29[5] = 0xbb;
                      puVar29[6] = 0x8c;
                      puVar29[7] = '^';
                      puVar29[8] = '\a';
                      puVar29[9] = 0x9e;
                      puVar29[10] = '\t';
                      puVar29[0xb] = 0xe2;
                      puVar29[0xc] = 200;
                      puVar29[0xd] = 0xa8;
                      puVar29[0xe] = '3';
                      puVar29[0xf] = 0x9c;
                      puVar36 = puVar36 + sVar51;
                      puVar36[0] = 0xcf;
                      puVar36[1] = '!';
                      puVar36[2] = 0xad;
                      puVar36[3] = 't';
                      puVar36[4] = 0xe5;
                      puVar36[5] = 0x9a;
                      puVar36[6] = 'a';
                      puVar36[7] = '\x11';
                      puVar36[8] = 0xbe;
                      puVar36[9] = '\x1d';
                      puVar36[10] = 0x8c;
                      puVar36[0xb] = '\x02';
                      puVar36[0xc] = '\x1e';
                      puVar36[0xd] = 'e';
                      puVar36[0xe] = 0xb8;
                      puVar36[0xf] = 0x91;
                      ppVar14 = emitter->buf;
                      ppVar14->off = ppVar14->off + 0x20;
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
                      if (iVar26 == 0) {
                        ppVar14->base[ppVar14->off] = '\0';
                        ppVar14->off = ppVar14->off + 1;
                        sVar51 = emitter->buf->off;
                        iVar26 = ptls_buffer__do_pushv
                                           (emitter->buf,(ch->legacy_session_id).base,
                                            (ch->legacy_session_id).len);
                        if (iVar26 == 0) {
                          uVar41 = emitter->buf->off - sVar51;
                          iVar27 = 0x20c;
                          iVar26 = iVar27;
                          if (uVar41 < 0x100) {
                            emitter->buf->base[sVar51 - 1] = (uint8_t)uVar41;
                            uVar4 = tls->cipher_suite->id;
                            ppVar14 = emitter->buf;
                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                            if (iVar26 == 0) {
                              *(ushort *)(ppVar14->base + ppVar14->off) = uVar4 << 8 | uVar4 >> 8;
                              ppVar14->off = ppVar14->off + 2;
                              ppVar14 = emitter->buf;
                              iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
                              if (iVar26 == 0) {
                                ppVar14->base[ppVar14->off] = '\0';
                                ppVar14->off = ppVar14->off + 1;
                                ppVar14 = emitter->buf;
                                iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                if (iVar26 == 0) {
                                  puVar36 = ppVar14->base;
                                  sVar51 = ppVar14->off;
                                  (puVar36 + sVar51)[0] = '\0';
                                  (puVar36 + sVar51)[1] = '\0';
                                  ppVar14->off = ppVar14->off + 2;
                                  ppVar14 = emitter->buf;
                                  sVar51 = ppVar14->off;
                                  iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                  if (iVar26 == 0) {
                                    puVar36 = ppVar14->base;
                                    sVar37 = ppVar14->off;
                                    (puVar36 + sVar37)[0] = '\0';
                                    (puVar36 + sVar37)[1] = '+';
                                    ppVar14->off = ppVar14->off + 2;
                                    ppVar14 = emitter->buf;
                                    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                    if (iVar26 == 0) {
                                      puVar36 = ppVar14->base;
                                      sVar37 = ppVar14->off;
                                      (puVar36 + sVar37)[0] = '\0';
                                      (puVar36 + sVar37)[1] = '\0';
                                      ppVar14->off = ppVar14->off + 2;
                                      ppVar14 = emitter->buf;
                                      sVar37 = ppVar14->off;
                                      uVar4 = ch->selected_version;
                                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                      puVar36 = local_a18.server_name.base;
                                      if (iVar26 == 0) {
                                        *(ushort *)(ppVar14->base + ppVar14->off) =
                                             uVar4 << 8 | uVar4 >> 8;
                                        ppVar14->off = ppVar14->off + 2;
                                        uVar41 = emitter->buf->off - sVar37;
                                        iVar26 = iVar27;
                                        if (uVar41 < 0x10000) {
                                          emitter->buf->base[sVar37 - 2] = (uint8_t)(uVar41 >> 8);
                                          emitter->buf->base[sVar37 - 1] = (uint8_t)uVar41;
                                          if ((ptls_key_exchange_algorithm_t *)
                                              local_a18.server_name.base !=
                                              (ptls_key_exchange_algorithm_t *)0x0 &&
                                              ppVar44 == (ptls_key_exchange_algorithm_t *)0x0) {
                                            ppVar14 = emitter->buf;
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            puVar29 = ppVar14->base;
                                            sVar37 = ppVar14->off;
                                            (puVar29 + sVar37)[0] = '\0';
                                            (puVar29 + sVar37)[1] = '3';
                                            ppVar14->off = ppVar14->off + 2;
                                            ppVar14 = emitter->buf;
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            puVar29 = ppVar14->base;
                                            sVar37 = ppVar14->off;
                                            (puVar29 + sVar37)[0] = '\0';
                                            (puVar29 + sVar37)[1] = '\0';
                                            ppVar14->off = ppVar14->off + 2;
                                            ppVar14 = emitter->buf;
                                            sVar37 = ppVar14->off;
                                            uVar4 = *(uint16_t *)puVar36;
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            *(ushort *)(ppVar14->base + ppVar14->off) =
                                                 uVar4 << 8 | uVar4 >> 8;
                                            ppVar14->off = ppVar14->off + 2;
                                            uVar41 = emitter->buf->off - sVar37;
                                            iVar26 = iVar27;
                                            if (0xffff < uVar41) goto LAB_0012065f;
                                            emitter->buf->base[sVar37 - 2] = (uint8_t)(uVar41 >> 8);
                                            emitter->buf->base[sVar37 - 1] = (uint8_t)uVar41;
                                          }
                                          ppVar14 = emitter->buf;
                                          if ((undefined1  [112])
                                              ((undefined1  [112])tls->ech & (undefined1  [112])0x4)
                                              == (undefined1  [112])0x0) {
                                            local_b18 = 0;
                                          }
                                          else {
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            puVar29 = ppVar14->base;
                                            sVar37 = ppVar14->off;
                                            (puVar29 + sVar37)[0] = 0xfe;
                                            (puVar29 + sVar37)[1] = '\r';
                                            ppVar14->off = ppVar14->off + 2;
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            puVar29 = ppVar14->base;
                                            sVar37 = ppVar14->off;
                                            (puVar29 + sVar37)[0] = '\0';
                                            (puVar29 + sVar37)[1] = '\0';
                                            sVar37 = ppVar14->off;
                                            ppVar14->off = sVar37 + 2;
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,8,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            puVar29 = ppVar14->base + ppVar14->off;
                                            puVar29[0] = '\0';
                                            puVar29[1] = '\0';
                                            puVar29[2] = '\0';
                                            puVar29[3] = '\0';
                                            puVar29[4] = '\0';
                                            puVar29[5] = '\0';
                                            puVar29[6] = '\0';
                                            puVar29[7] = '\0';
                                            local_b18 = ppVar14->off;
                                            ppVar14->off = local_b18 + 8;
                                            uVar41 = (local_b18 + 8) - (sVar37 + 2);
                                            iVar26 = iVar27;
                                            if (0xffff < uVar41) goto LAB_0012065f;
                                            ppVar14->base[sVar37] = (uint8_t)(uVar41 >> 8);
                                            ppVar14->base[sVar37 + 1] = (uint8_t)uVar41;
                                          }
                                          if (bVar23) {
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            puVar29 = ppVar14->base;
                                            sVar37 = ppVar14->off;
                                            (puVar29 + sVar37)[0] = '\0';
                                            (puVar29 + sVar37)[1] = ',';
                                            ppVar14->off = ppVar14->off + 2;
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            puVar29 = ppVar14->base;
                                            sVar37 = ppVar14->off;
                                            (puVar29 + sVar37)[0] = '\0';
                                            (puVar29 + sVar37)[1] = '\0';
                                            sVar37 = ppVar14->off;
                                            ppVar14->off = sVar37 + 2;
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            puVar29 = ppVar14->base;
                                            sVar15 = ppVar14->off;
                                            (puVar29 + sVar15)[0] = '\0';
                                            (puVar29 + sVar15)[1] = '\0';
                                            sVar15 = ppVar14->off;
                                            sVar46 = sVar15 + 2;
                                            ppVar14->off = sVar46;
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            puVar29 = ppVar14->base;
                                            sVar17 = ppVar14->off;
                                            (puVar29 + sVar17)[0] = '\0';
                                            (puVar29 + sVar17)[1] = '\0';
                                            sVar17 = ppVar14->off;
                                            ppVar14->off = sVar17 + 2;
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            ppVar14->base[ppVar14->off] = '\0';
                                            local_a78 = ppVar14->off + 1;
                                            ppVar14->off = local_a78;
                                            local_a30 = tls->cipher_suite->hash->digest_size;
                                            iVar26 = ptls_buffer_reserve_aligned
                                                               (ppVar14,local_a30,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            local_a38 = ppVar14;
                                            key_schedule_extract_ch1hash
                                                      (tls->key_schedule,
                                                       ppVar14->base + ppVar14->off);
                                            sVar35 = local_a30 + local_a38->off;
                                            local_a38->off = sVar35;
                                            uVar41 = sVar35 - local_a78;
                                            iVar26 = iVar27;
                                            if (0xff < uVar41) goto LAB_0012065f;
                                            ppVar14->base[local_a78 - 1] = (uint8_t)uVar41;
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            ppVar14->base[ppVar14->off] =
                                                 ppVar44 == (ptls_key_exchange_algorithm_t *)0x0;
                                            sVar35 = ppVar14->off + 1;
                                            ppVar14->off = sVar35;
                                            uVar41 = sVar35 - (sVar17 + 2);
                                            iVar26 = iVar27;
                                            if (0xffff < uVar41) goto LAB_0012065f;
                                            ppVar14->base[sVar17] = (uint8_t)(uVar41 >> 8);
                                            ppVar14->base[sVar17 + 1] = (uint8_t)uVar41;
                                            sVar17 = ppVar14->off;
                                            iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
                                            if (iVar26 != 0) goto LAB_0012065f;
                                            ppVar14->base[ppVar14->off] = '\0';
                                            sVar35 = ppVar14->off;
                                            sVar39 = sVar35 + 1;
                                            ppVar14->off = sVar39;
                                            sVar40 = (*tls->ctx->cipher_suites)->hash->digest_size;
                                            iVar26 = ptls_buffer_reserve_aligned
                                                               (ppVar14,sVar40,'\0');
                                            if ((iVar26 != 0) ||
                                               (tbs.len = sVar17 - sVar46,
                                               tbs.base = ppVar14->base + sVar46,
                                               iVar26 = calc_cookie_signature
                                                                  (tls,properties,
                                                                   (ptls_key_exchange_algorithm_t *)
                                                                   puVar36,tbs,
                                                                   ppVar14->base + ppVar14->off),
                                               iVar26 != 0)) goto LAB_0012065f;
                                            sVar40 = sVar40 + ppVar14->off;
                                            ppVar14->off = sVar40;
                                            uVar41 = sVar40 - sVar39;
                                            iVar26 = iVar27;
                                            if (0xff < uVar41) goto LAB_0012065f;
                                            ppVar14->base[sVar35] = (uint8_t)uVar41;
                                            uVar41 = ppVar14->off - sVar46;
                                            if (0xffff < uVar41) goto LAB_0012065f;
                                            ppVar14->base[sVar15] = (uint8_t)(uVar41 >> 8);
                                            ppVar14->base[sVar15 + 1] = (uint8_t)uVar41;
                                            uVar41 = ppVar14->off - (sVar37 + 2);
                                            if (0xffff < uVar41) goto LAB_0012065f;
                                            ppVar14->base[sVar37] = (uint8_t)(uVar41 >> 8);
                                            ppVar14->base[sVar37 + 1] = (uint8_t)uVar41;
                                          }
                                          uVar41 = emitter->buf->off - sVar51;
                                          iVar26 = iVar27;
                                          if (uVar41 < 0x10000) {
                                            emitter->buf->base[sVar51 - 2] = (uint8_t)(uVar41 >> 8);
                                            emitter->buf->base[sVar51 - 1] = (uint8_t)uVar41;
                                            uVar41 = ppVar34->off - (sVar30 + 3);
                                            if (uVar41 < 0x1000000) {
                                              lVar43 = sVar50 - 4;
                                              lVar42 = 0x10;
                                              do {
                                                ppVar34->base[sVar30] =
                                                     (uint8_t)(uVar41 >> ((byte)lVar42 & 0x3f));
                                                lVar42 = lVar42 + -8;
                                                sVar30 = sVar30 + 1;
                                              } while (lVar42 != -8);
                                              iVar26 = (*emitter->commit_message)(emitter);
                                              if ((iVar26 == 0) &&
                                                 ((local_b18 == 0 ||
                                                  (puVar36 = emitter->buf->base,
                                                  message_00.base = puVar36 + lVar43,
                                                  message_00.len = emitter->buf->off - lVar43,
                                                  iVar26 = ech_calc_confirmation
                                                                     (tls->key_schedule,
                                                                      puVar36 + local_b18,
                                                                      (tls->ech).inner_client_random
                                                                      ,"hrr ech accept confirmation"
                                                                      ,message_00), iVar26 == 0))))
                                              {
                                                ppVar32 = tls->key_schedule;
                                                if (ppVar32->num_hashes != 0) {
                                                  puVar36 = emitter->buf->base;
                                                  sVar30 = emitter->buf->off;
                                                  pppVar45 = &ppVar32->hashes[0].ctx;
                                                  sVar50 = 0;
                                                  do {
                                                    (*(*pppVar45)->update)
                                                              (*pppVar45,puVar36 + lVar43,
                                                               sVar30 - lVar43);
                                                    sVar50 = sVar50 + 1;
                                                    pppVar45 = pppVar45 + 3;
                                                  } while (sVar50 != ppVar32->num_hashes);
                                                }
                                                if (bVar23) {
                                                  iVar27 = push_change_cipher_spec(tls,emitter);
                                                  iVar26 = 0x206;
                                                  if (iVar27 != 0) {
                                                    iVar26 = iVar27;
                                                  }
                                                }
                                                else {
                                                  tls->state = 
                                                  PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                                                  iVar26 = 0x202;
                                                  if (((ch->psk).field_0xb4 & 1) != 0) {
                                                    (tls->field_19).server.early_data_skipped_bytes
                                                         = 0;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_0012065f;
      }
      if (properties == (ptls_handshake_properties_t *)0x0) {
        iVar27 = 0;
      }
      else {
        iVar27 = 0;
        if ((*(byte *)((long)&properties->field_0 + 0x60) & 1) != 0) goto LAB_00120f4a;
      }
    }
  }
  else {
    sVar30 = (*tls->ctx->cipher_suites)->hash->digest_size;
    iVar26 = calc_cookie_signature(tls,properties,local_a98,(ch->cookie).tbs,(uint8_t *)&local_a18);
    if (((iVar26 != 0) || (iVar26 = 0x28, (ch->cookie).signature.len != sVar30)) ||
       (iVar27 = (*ptls_mem_equal)((ch->cookie).signature.base,&local_a18,sVar30), iVar27 == 0))
    goto LAB_0012065f;
    key_schedule_update_ch1hash_prefix(tls->key_schedule);
    ppVar32 = tls->key_schedule;
    if (ppVar32->num_hashes != 0) {
      puVar36 = (ch->cookie).ch1_hash.base;
      sVar30 = (ch->cookie).ch1_hash.len;
      pppVar45 = &ppVar32->hashes[0].ctx;
      sVar50 = 0;
      do {
        (*(*pppVar45)->update)(*pppVar45,puVar36,sVar30);
        sVar50 = sVar50 + 1;
        pppVar45 = pppVar45 + 3;
      } while (sVar50 != ppVar32->num_hashes);
      ppVar32 = tls->key_schedule;
    }
    key_schedule_extract(ppVar32,(tls->ctx->pre_shared_key).secret);
    sVar30 = emitter->buf->off;
    iVar26 = (*emitter->begin_message)(emitter);
    if (iVar26 != 0) goto LAB_0012065f;
    ppVar34 = emitter->buf;
    iVar26 = ptls_buffer_reserve_aligned(ppVar34,1,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    ppVar34->base[ppVar34->off] = '\x02';
    ppVar34->off = ppVar34->off + 1;
    iVar26 = ptls_buffer_reserve_aligned(ppVar34,3,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = ppVar34->base;
    sVar50 = ppVar34->off;
    puVar36[sVar50 + 2] = '\0';
    puVar36 = puVar36 + sVar50;
    puVar36[0] = '\0';
    puVar36[1] = '\0';
    local_b18 = ppVar34->off;
    ppVar34->off = local_b18 + 3;
    ppVar14 = emitter->buf;
    sVar50 = ppVar14->off;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = ppVar14->base;
    sVar51 = ppVar14->off;
    (puVar36 + sVar51)[0] = '\x03';
    (puVar36 + sVar51)[1] = '\x03';
    ppVar14->off = ppVar14->off + 2;
    iVar26 = ptls_buffer_reserve_aligned(emitter->buf,0x20,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = emitter->buf->base;
    sVar51 = emitter->buf->off;
    puVar29 = puVar36 + sVar51 + 0x10;
    puVar29[0] = 0xc2;
    puVar29[1] = 0xa2;
    puVar29[2] = '\x11';
    puVar29[3] = '\x16';
    puVar29[4] = 'z';
    puVar29[5] = 0xbb;
    puVar29[6] = 0x8c;
    puVar29[7] = '^';
    puVar29[8] = '\a';
    puVar29[9] = 0x9e;
    puVar29[10] = '\t';
    puVar29[0xb] = 0xe2;
    puVar29[0xc] = 200;
    puVar29[0xd] = 0xa8;
    puVar29[0xe] = '3';
    puVar29[0xf] = 0x9c;
    puVar36 = puVar36 + sVar51;
    puVar36[0] = 0xcf;
    puVar36[1] = '!';
    puVar36[2] = 0xad;
    puVar36[3] = 't';
    puVar36[4] = 0xe5;
    puVar36[5] = 0x9a;
    puVar36[6] = 'a';
    puVar36[7] = '\x11';
    puVar36[8] = 0xbe;
    puVar36[9] = '\x1d';
    puVar36[10] = 0x8c;
    puVar36[0xb] = '\x02';
    puVar36[0xc] = '\x1e';
    puVar36[0xd] = 'e';
    puVar36[0xe] = 0xb8;
    puVar36[0xf] = 0x91;
    ppVar14 = emitter->buf;
    ppVar14->off = ppVar14->off + 0x20;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    ppVar14->base[ppVar14->off] = '\0';
    ppVar14->off = ppVar14->off + 1;
    sVar51 = emitter->buf->off;
    iVar26 = ptls_buffer__do_pushv
                       (emitter->buf,(ch->legacy_session_id).base,(ch->legacy_session_id).len);
    if (iVar26 != 0) goto LAB_0012065f;
    uVar41 = emitter->buf->off - sVar51;
    iVar27 = 0x20c;
    iVar26 = iVar27;
    if (0xff < uVar41) goto LAB_0012065f;
    emitter->buf->base[sVar51 - 1] = (uint8_t)uVar41;
    uVar4 = tls->cipher_suite->id;
    ppVar14 = emitter->buf;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    *(ushort *)(ppVar14->base + ppVar14->off) = uVar4 << 8 | uVar4 >> 8;
    ppVar14->off = ppVar14->off + 2;
    ppVar14 = emitter->buf;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    ppVar14->base[ppVar14->off] = '\0';
    ppVar14->off = ppVar14->off + 1;
    ppVar14 = emitter->buf;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = ppVar14->base;
    sVar51 = ppVar14->off;
    (puVar36 + sVar51)[0] = '\0';
    (puVar36 + sVar51)[1] = '\0';
    ppVar14->off = ppVar14->off + 2;
    ppVar14 = emitter->buf;
    sVar51 = ppVar14->off;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = ppVar14->base;
    sVar37 = ppVar14->off;
    (puVar36 + sVar37)[0] = '\0';
    (puVar36 + sVar37)[1] = '+';
    ppVar14->off = ppVar14->off + 2;
    ppVar14 = emitter->buf;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = ppVar14->base;
    sVar37 = ppVar14->off;
    (puVar36 + sVar37)[0] = '\0';
    (puVar36 + sVar37)[1] = '\0';
    ppVar14->off = ppVar14->off + 2;
    ppVar14 = emitter->buf;
    sVar37 = ppVar14->off;
    uVar4 = ch->selected_version;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    *(ushort *)(ppVar14->base + ppVar14->off) = uVar4 << 8 | uVar4 >> 8;
    ppVar14->off = ppVar14->off + 2;
    uVar41 = emitter->buf->off - sVar37;
    iVar26 = iVar27;
    if (0xffff < uVar41) goto LAB_0012065f;
    emitter->buf->base[sVar37 - 2] = (uint8_t)(uVar41 >> 8);
    emitter->buf->base[sVar37 - 1] = (uint8_t)uVar41;
    if (((ch->cookie).field_0x40 & 1) != 0) {
      ppVar14 = emitter->buf;
      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
      if (iVar26 != 0) goto LAB_0012065f;
      puVar36 = ppVar14->base;
      sVar37 = ppVar14->off;
      (puVar36 + sVar37)[0] = '\0';
      (puVar36 + sVar37)[1] = '3';
      ppVar14->off = ppVar14->off + 2;
      ppVar14 = emitter->buf;
      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
      if (iVar26 != 0) goto LAB_0012065f;
      puVar36 = ppVar14->base;
      sVar37 = ppVar14->off;
      (puVar36 + sVar37)[0] = '\0';
      (puVar36 + sVar37)[1] = '\0';
      ppVar14->off = ppVar14->off + 2;
      ppVar14 = emitter->buf;
      sVar37 = ppVar14->off;
      uVar4 = ppVar44->id;
      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
      if (iVar26 != 0) goto LAB_0012065f;
      *(ushort *)(ppVar14->base + ppVar14->off) = uVar4 << 8 | uVar4 >> 8;
      ppVar14->off = ppVar14->off + 2;
      uVar41 = emitter->buf->off - sVar37;
      iVar26 = iVar27;
      if (0xffff < uVar41) goto LAB_0012065f;
      emitter->buf->base[sVar37 - 2] = (uint8_t)(uVar41 >> 8);
      emitter->buf->base[sVar37 - 1] = (uint8_t)uVar41;
    }
    ppVar14 = emitter->buf;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = ppVar14->base;
    sVar37 = ppVar14->off;
    (puVar36 + sVar37)[0] = '\0';
    (puVar36 + sVar37)[1] = ',';
    ppVar14->off = ppVar14->off + 2;
    ppVar14 = emitter->buf;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = ppVar14->base;
    sVar37 = ppVar14->off;
    (puVar36 + sVar37)[0] = '\0';
    (puVar36 + sVar37)[1] = '\0';
    ppVar14->off = ppVar14->off + 2;
    sVar37 = emitter->buf->off;
    iVar26 = ptls_buffer__do_pushv(emitter->buf,(ch->cookie).all.base,(ch->cookie).all.len);
    if (iVar26 != 0) goto LAB_0012065f;
    uVar41 = emitter->buf->off - sVar37;
    iVar26 = iVar27;
    if (0xffff < uVar41) goto LAB_0012065f;
    emitter->buf->base[sVar37 - 2] = (uint8_t)(uVar41 >> 8);
    emitter->buf->base[sVar37 - 1] = (uint8_t)uVar41;
    uVar41 = emitter->buf->off - sVar51;
    if (0xffff < uVar41) goto LAB_0012065f;
    emitter->buf->base[sVar51 - 2] = (uint8_t)(uVar41 >> 8);
    emitter->buf->base[sVar51 - 1] = (uint8_t)uVar41;
    uVar41 = ppVar34->off - (local_b18 + 3);
    iVar26 = 0x20c;
    if (0xffffff < uVar41) goto LAB_0012065f;
    lVar43 = sVar50 - 4;
    lVar42 = 0x10;
    do {
      ppVar34->base[local_b18] = (uint8_t)(uVar41 >> ((byte)lVar42 & 0x3f));
      lVar42 = lVar42 + -8;
      local_b18 = local_b18 + 1;
    } while (lVar42 != -8);
    iVar26 = (*emitter->commit_message)(emitter);
    if (iVar26 != 0) goto LAB_0012065f;
    ppVar32 = tls->key_schedule;
    ppVar34 = emitter->buf;
    if (ppVar32->num_hashes != 0) {
      puVar36 = ppVar34->base;
      sVar50 = ppVar34->off;
      pppVar45 = &ppVar32->hashes[0].ctx;
      sVar51 = 0;
      do {
        (*(*pppVar45)->update)(*pppVar45,puVar36 + lVar43,sVar50 - lVar43);
        sVar51 = sVar51 + 1;
        pppVar45 = pppVar45 + 3;
      } while (sVar51 != ppVar32->num_hashes);
      ppVar34 = emitter->buf;
    }
    ppVar34->off = sVar30;
    iVar27 = 1;
    bVar23 = false;
  }
  iVar26 = report_unknown_extensions(tls,properties,ch->unknown_extensions);
  if (iVar26 != 0) goto LAB_0012065f;
  puVar36 = (ch->psk).hash_end;
  sVar30 = 0xffffffffffffffff;
  if (((((puVar36 != (uint8_t *)0x0) && (((ch->psk).ke_modes & 3) != 0)) &&
       (ppVar49 = tls->ctx, (ppVar49->field_0xb8 & 8) == 0)) &&
      (((bVar23 && (ppVar49->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0)) ||
       ((ppVar49->pre_shared_key).identity.base != (uint8_t *)0x0)))) &&
     (ch_trunc.len = (long)puVar36 - (long)local_b08, ch_trunc.base = local_b08,
     iVar26 = try_psk_handshake(tls,&local_a70,&local_abc,ch,ch_trunc,iVar27), sVar30 = local_a70,
     iVar26 != 0)) goto LAB_0012065f;
  iVar26 = 0x73;
  if ((tls->ctx->pre_shared_key).identity.base != (uint8_t *)0x0 && sVar30 == 0xffffffffffffffff)
  goto LAB_0012065f;
  if ((sVar30 == 0xffffffffffffffff) || ((tls->ctx->field_0xb8 & 8) != 0)) {
    ppVar32 = tls->key_schedule;
    if (ppVar32->num_hashes != 0) {
      pppVar45 = &ppVar32->hashes[0].ctx;
      sVar50 = 0;
      do {
        (*(*pppVar45)->update)(*pppVar45,local_b08,(size_t)local_b10);
        sVar50 = sVar50 + 1;
        pppVar45 = pppVar45 + 3;
      } while (sVar50 != ppVar32->num_hashes);
    }
    if (bVar23) {
      if (tls->key_schedule->generation != 0) {
        __assert_fail("tls->key_schedule->generation == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0x1243,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
    }
    iVar27 = 0;
    if (properties != (ptls_handshake_properties_t *)0x0) {
      ppVar52 = (ptls_iovec_t *)0x0;
      iVar27 = 0;
      goto LAB_00121830;
    }
  }
  else {
    ppVar32 = tls->key_schedule;
    if (ppVar32->num_hashes != 0) {
      puVar36 = (ch->psk).hash_end;
      pppVar45 = &ppVar32->hashes[0].ctx;
      sVar50 = 0;
      do {
        (*(*pppVar45)->update)
                  (*pppVar45,puVar36,(long)(local_b08 + (long)local_b10) - (long)puVar36);
        sVar50 = sVar50 + 1;
        pppVar45 = pppVar45 + 3;
      } while (sVar50 != ppVar32->num_hashes);
    }
    uVar48 = (ch->psk).ke_modes;
    iVar27 = 1;
    if (((uVar48 & 1) == 0) && (iVar27 = 2, (uVar48 & 2) == 0)) {
      __assert_fail("(ch->psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x124e,
                    "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                   );
    }
    tls->field_0x1e8 = tls->field_0x1e8 | 2;
    if (properties != (ptls_handshake_properties_t *)0x0) {
      ppVar52 = (ptls_iovec_t *)(ch->psk).identities.list[sVar30].binder.len;
      memcpy(properties,(ch->psk).identities.list[sVar30].binder.base,(size_t)ppVar52);
LAB_00121830:
      (properties->field_0).client.ech.retry_configs = ppVar52;
    }
  }
  if (((ch->psk).ke_modes == 0) || (ppVar49 = tls->ctx, ppVar49->ticket_lifetime == 0)) {
    bVar38 = 0;
LAB_001218cf:
    (tls->field_19).server.num_tickets_to_send = bVar38;
  }
  else {
    bVar25 = (ch->ticket_request).new_session_count;
    if (bVar25 == 0) {
      bVar25 = 1;
    }
    else if ((tls->field_0x1e8 & 2) != 0) {
      bVar25 = (ch->ticket_request).resumption_count;
    }
    (tls->field_19).server.num_tickets_to_send = bVar25;
    bVar2 = (ppVar49->ticket_requests).server.max_count;
    bVar38 = 4;
    if (bVar2 != 0) {
      bVar38 = bVar2;
    }
    if (bVar38 < bVar25) goto LAB_001218cf;
  }
  if ((local_abc != 0) && (sVar30 == 0 && tls->ctx->max_early_data_size != 0)) {
    puVar36 = (uint8_t *)malloc(0x40);
    tls->pending_handshake_secret = puVar36;
    iVar26 = 0x201;
    if ((puVar36 == (uint8_t *)0x0) ||
       ((iVar26 = derive_exporter_secret(tls,1), iVar26 != 0 ||
        (iVar26 = setup_traffic_protection(tls,0,"c e traffic",1,0,0), iVar26 != 0))))
    goto LAB_0012065f;
  }
  ppVar44 = local_a98;
  if (iVar27 != 1) {
    if (local_a98 == (st_ptls_key_exchange_algorithm_t *)0x0) {
      iVar26 = 0x28;
      if ((ch->key_shares).base == (uint8_t *)0x0) {
        iVar26 = 0x6d;
      }
      goto LAB_0012065f;
    }
    pVar22.len = pStack_a90.len;
    pVar22.base = pStack_a90.base;
    iVar26 = (*local_a98->exchange)(local_a98,&local_aa8,&local_ab8,pVar22);
    if (iVar26 != 0) {
      if (local_aa8.base != (uint8_t *)0x0) {
        __assert_fail("pubkey.base == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0x127c,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      if (local_ab8.base != (uint8_t *)0x0) {
        __assert_fail("ecdh_secret.base == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0x127d,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      goto LAB_0012065f;
    }
    tls->key_share = ppVar44;
  }
  iVar26 = (*emitter->begin_message)(emitter);
  if (iVar26 != 0) goto LAB_0012065f;
  ppVar34 = emitter->buf;
  iVar26 = ptls_buffer_reserve_aligned(ppVar34,1,'\0');
  if (iVar26 != 0) goto LAB_0012065f;
  ppVar34->base[ppVar34->off] = '\x02';
  ppVar34->off = ppVar34->off + 1;
  iVar26 = ptls_buffer_reserve_aligned(ppVar34,3,'\0');
  if (iVar26 != 0) goto LAB_0012065f;
  puVar36 = ppVar34->base;
  sVar50 = ppVar34->off;
  puVar36[sVar50 + 2] = '\0';
  puVar36 = puVar36 + sVar50;
  puVar36[0] = '\0';
  puVar36[1] = '\0';
  sVar50 = ppVar34->off;
  ppVar34->off = sVar50 + 3;
  ppVar14 = emitter->buf;
  sVar51 = ppVar14->off;
  iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
  if (iVar26 != 0) goto LAB_0012065f;
  puVar36 = ppVar14->base;
  sVar37 = ppVar14->off;
  (puVar36 + sVar37)[0] = '\x03';
  (puVar36 + sVar37)[1] = '\x03';
  ppVar14->off = ppVar14->off + 2;
  iVar26 = ptls_buffer_reserve_aligned(emitter->buf,0x20,'\0');
  if (iVar26 != 0) goto LAB_0012065f;
  (*tls->ctx->random_bytes)(emitter->buf->base + emitter->buf->off,0x20);
  if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x4) ==
      (undefined1  [112])0x0) {
    local_b00 = 0;
  }
  else {
    local_b00 = emitter->buf->off;
    puVar36 = emitter->buf->base + local_b00 + 0x18;
    puVar36[0] = '\0';
    puVar36[1] = '\0';
    puVar36[2] = '\0';
    puVar36[3] = '\0';
    puVar36[4] = '\0';
    puVar36[5] = '\0';
    puVar36[6] = '\0';
    puVar36[7] = '\0';
    local_b00 = local_b00 + 0x18;
  }
  ppVar14 = emitter->buf;
  ppVar14->off = ppVar14->off + 0x20;
  iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
  if (iVar26 != 0) goto LAB_0012065f;
  ppVar14->base[ppVar14->off] = '\0';
  ppVar14->off = ppVar14->off + 1;
  sVar37 = emitter->buf->off;
  iVar26 = ptls_buffer__do_pushv
                     (emitter->buf,(ch->legacy_session_id).base,(ch->legacy_session_id).len);
  if (iVar26 != 0) goto LAB_0012065f;
  uVar41 = emitter->buf->off - sVar37;
  iVar53 = 0x20c;
  iVar26 = iVar53;
  if (0xff < uVar41) goto LAB_0012065f;
  emitter->buf->base[sVar37 - 1] = (uint8_t)uVar41;
  uVar4 = tls->cipher_suite->id;
  ppVar14 = emitter->buf;
  iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
  if (iVar26 != 0) goto LAB_0012065f;
  *(ushort *)(ppVar14->base + ppVar14->off) = uVar4 << 8 | uVar4 >> 8;
  ppVar14->off = ppVar14->off + 2;
  ppVar14 = emitter->buf;
  iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
  if (iVar26 != 0) goto LAB_0012065f;
  ppVar14->base[ppVar14->off] = '\0';
  ppVar14->off = ppVar14->off + 1;
  ppVar14 = emitter->buf;
  iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
  if (iVar26 != 0) goto LAB_0012065f;
  puVar36 = ppVar14->base;
  sVar37 = ppVar14->off;
  (puVar36 + sVar37)[0] = '\0';
  (puVar36 + sVar37)[1] = '\0';
  ppVar14->off = ppVar14->off + 2;
  ppVar14 = emitter->buf;
  sVar37 = ppVar14->off;
  iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
  if (iVar26 != 0) goto LAB_0012065f;
  puVar36 = ppVar14->base;
  sVar15 = ppVar14->off;
  (puVar36 + sVar15)[0] = '\0';
  (puVar36 + sVar15)[1] = '+';
  ppVar14->off = ppVar14->off + 2;
  ppVar14 = emitter->buf;
  iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
  if (iVar26 != 0) goto LAB_0012065f;
  puVar36 = ppVar14->base;
  sVar15 = ppVar14->off;
  (puVar36 + sVar15)[0] = '\0';
  (puVar36 + sVar15)[1] = '\0';
  ppVar14->off = ppVar14->off + 2;
  ppVar14 = emitter->buf;
  sVar15 = ppVar14->off;
  uVar4 = ch->selected_version;
  iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
  if (iVar26 != 0) goto LAB_0012065f;
  *(ushort *)(ppVar14->base + ppVar14->off) = uVar4 << 8 | uVar4 >> 8;
  ppVar14->off = ppVar14->off + 2;
  uVar41 = emitter->buf->off - sVar15;
  iVar26 = iVar53;
  if (0xffff < uVar41) goto LAB_0012065f;
  emitter->buf->base[sVar15 - 2] = (uint8_t)(uVar41 >> 8);
  emitter->buf->base[sVar15 - 1] = (uint8_t)uVar41;
  ppVar14 = emitter->buf;
  if (iVar27 == 1) {
LAB_00121d7b:
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = ppVar14->base;
    sVar15 = ppVar14->off;
    (puVar36 + sVar15)[0] = '\0';
    (puVar36 + sVar15)[1] = ')';
    ppVar14->off = ppVar14->off + 2;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = ppVar14->base;
    sVar15 = ppVar14->off;
    (puVar36 + sVar15)[0] = '\0';
    (puVar36 + sVar15)[1] = '\0';
    sVar15 = ppVar14->off;
    ppVar14->off = sVar15 + 2;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    *(ushort *)(ppVar14->base + ppVar14->off) = (ushort)sVar30 << 8 | (ushort)sVar30 >> 8;
    sVar30 = ppVar14->off;
    ppVar14->off = sVar30 + 2;
    uVar41 = sVar30 - sVar15;
    iVar26 = iVar53;
    if (0xffff < uVar41) goto LAB_0012065f;
    ppVar14->base[sVar15] = (uint8_t)(uVar41 >> 8);
    ppVar14->base[sVar15 + 1] = (uint8_t)uVar41;
  }
  else {
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = ppVar14->base;
    sVar15 = ppVar14->off;
    (puVar36 + sVar15)[0] = '\0';
    (puVar36 + sVar15)[1] = '3';
    ppVar14->off = ppVar14->off + 2;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = ppVar14->base;
    sVar15 = ppVar14->off;
    (puVar36 + sVar15)[0] = '\0';
    (puVar36 + sVar15)[1] = '\0';
    sVar15 = ppVar14->off;
    ppVar14->off = sVar15 + 2;
    uVar4 = local_a98->id;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    *(ushort *)(ppVar14->base + ppVar14->off) = uVar4 << 8 | uVar4 >> 8;
    ppVar14->off = ppVar14->off + 2;
    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
    if (iVar26 != 0) goto LAB_0012065f;
    puVar36 = ppVar14->base;
    sVar46 = ppVar14->off;
    (puVar36 + sVar46)[0] = '\0';
    (puVar36 + sVar46)[1] = '\0';
    sVar46 = ppVar14->off;
    ppVar14->off = sVar46 + 2;
    iVar26 = ptls_buffer__do_pushv(ppVar14,local_aa8.base,local_aa8.len);
    if ((iVar26 != 0) || (uVar41 = ppVar14->off - (sVar46 + 2), iVar26 = iVar53, 0xffff < uVar41))
    goto LAB_0012065f;
    ppVar14->base[sVar46] = (uint8_t)(uVar41 >> 8);
    ppVar14->base[sVar46 + 1] = (uint8_t)uVar41;
    uVar41 = ppVar14->off - (sVar15 + 2);
    if (0xffff < uVar41) goto LAB_0012065f;
    ppVar14->base[sVar15] = (uint8_t)(uVar41 >> 8);
    ppVar14->base[sVar15 + 1] = (uint8_t)uVar41;
    if (iVar27 != 0) goto LAB_00121d7b;
  }
  uVar41 = emitter->buf->off - sVar37;
  iVar26 = iVar53;
  if (uVar41 < 0x10000) {
    emitter->buf->base[sVar37 - 2] = (uint8_t)(uVar41 >> 8);
    emitter->buf->base[sVar37 - 1] = (uint8_t)uVar41;
    uVar41 = ppVar34->off - (sVar50 + 3);
    if (uVar41 < 0x1000000) {
      lVar43 = sVar51 - 4;
      lVar42 = 0x10;
      do {
        ppVar34->base[sVar50] = (uint8_t)(uVar41 >> ((byte)lVar42 & 0x3f));
        lVar42 = lVar42 + -8;
        sVar50 = sVar50 + 1;
      } while (lVar42 != -8);
      iVar26 = (*emitter->commit_message)(emitter);
      if ((iVar26 == 0) &&
         ((local_b00 == 0 ||
          (puVar36 = emitter->buf->base, message_01.base = puVar36 + lVar43,
          message_01.len = emitter->buf->off - lVar43,
          iVar26 = ech_calc_confirmation
                             (tls->key_schedule,puVar36 + local_b00,(tls->ech).inner_client_random,
                              "ech accept confirmation",message_01), iVar26 == 0)))) {
        ppVar32 = tls->key_schedule;
        if (ppVar32->num_hashes != 0) {
          puVar36 = emitter->buf->base;
          sVar30 = emitter->buf->off;
          pppVar45 = &ppVar32->hashes[0].ctx;
          sVar50 = 0;
          do {
            (*(*pppVar45)->update)(*pppVar45,puVar36 + lVar43,sVar30 - lVar43);
            sVar50 = sVar50 + 1;
            pppVar45 = pppVar45 + 3;
          } while (sVar50 != ppVar32->num_hashes);
        }
        clear_ech(&tls->ech,1);
        iVar26 = push_change_cipher_spec(tls,emitter);
        if (iVar26 == 0) {
          if (tls->key_schedule->generation != 1) {
            __assert_fail("tls->key_schedule->generation == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                          ,0x12ad,
                          "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                         );
          }
          ikm.len = local_ab8.len;
          ikm.base = local_ab8.base;
          key_schedule_extract(tls->key_schedule,ikm);
          iVar26 = setup_traffic_protection(tls,1,"s hs traffic",2,0,0);
          if (iVar26 == 0) {
            if (tls->pending_handshake_secret == (uint8_t *)0x0) {
              iVar26 = setup_traffic_protection(tls,0,"c hs traffic",2,0,0);
              if (iVar26 != 0) goto LAB_0012065f;
              if (((ch->psk).field_0xb4 & 1) != 0) {
                (tls->field_19).server.early_data_skipped_bytes = 0;
              }
            }
            else {
              iVar26 = derive_secret(tls->key_schedule,tls->pending_handshake_secret,"c hs traffic")
              ;
              if ((iVar26 != 0) ||
                 ((psVar16 = tls->ctx->update_traffic_key,
                  psVar16 != (st_ptls_update_traffic_key_t *)0x0 &&
                  (iVar26 = (*psVar16->cb)(psVar16,tls,0,2,tls->pending_handshake_secret),
                  iVar26 != 0)))) goto LAB_0012065f;
            }
            iVar26 = (*emitter->begin_message)(emitter);
            if (iVar26 == 0) {
              ppVar34 = emitter->buf;
              ppVar32 = tls->key_schedule;
              sVar30 = ppVar34->off;
              iVar26 = ptls_buffer_reserve_aligned(ppVar34,1,'\0');
              if (iVar26 == 0) {
                ppVar34->base[ppVar34->off] = '\b';
                ppVar34->off = ppVar34->off + 1;
                iVar26 = ptls_buffer_reserve_aligned(ppVar34,3,'\0');
                if (iVar26 == 0) {
                  puVar36 = ppVar34->base;
                  sVar50 = ppVar34->off;
                  puVar36[sVar50 + 2] = '\0';
                  puVar36 = puVar36 + sVar50;
                  puVar36[0] = '\0';
                  puVar36[1] = '\0';
                  local_b18 = ppVar34->off;
                  ppVar34->off = local_b18 + 3;
                  ppVar14 = emitter->buf;
                  iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                  if (iVar26 == 0) {
                    puVar36 = ppVar14->base;
                    sVar50 = ppVar14->off;
                    (puVar36 + sVar50)[0] = '\0';
                    (puVar36 + sVar50)[1] = '\0';
                    sVar50 = ppVar14->off;
                    ppVar14->off = sVar50 + 2;
                    if (tls->server_name != (char *)0x0) {
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar51 = ppVar14->off;
                      (puVar36 + sVar51)[0] = '\0';
                      (puVar36 + sVar51)[1] = '\0';
                      ppVar14->off = ppVar14->off + 2;
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar51 = ppVar14->off;
                      (puVar36 + sVar51)[0] = '\0';
                      (puVar36 + sVar51)[1] = '\0';
                      sVar51 = ppVar14->off;
                      ppVar14->off = sVar51 + 2;
                      ppVar14->base[sVar51] = '\0';
                      ppVar14->base[sVar51 + 1] = '\0';
                    }
                    if ((tls->ctx->field_0xb8 & 0x20) != 0) {
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar51 = ppVar14->off;
                      (puVar36 + sVar51)[0] = '\0';
                      (puVar36 + sVar51)[1] = '\x14';
                      ppVar14->off = ppVar14->off + 2;
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar51 = ppVar14->off;
                      (puVar36 + sVar51)[0] = '\0';
                      (puVar36 + sVar51)[1] = '\0';
                      sVar51 = ppVar14->off;
                      ppVar14->off = sVar51 + 2;
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      ppVar14->base[ppVar14->off] = '\x02';
                      sVar37 = ppVar14->off + 1;
                      ppVar14->off = sVar37;
                      uVar41 = sVar37 - (sVar51 + 2);
                      iVar26 = iVar53;
                      if (0xffff < uVar41) goto LAB_0012065f;
                      ppVar14->base[sVar51] = (uint8_t)(uVar41 >> 8);
                      ppVar14->base[sVar51 + 1] = (uint8_t)uVar41;
                    }
                    if (tls->negotiated_protocol != (char *)0x0) {
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar51 = ppVar14->off;
                      (puVar36 + sVar51)[0] = '\0';
                      (puVar36 + sVar51)[1] = '\x10';
                      ppVar14->off = ppVar14->off + 2;
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar51 = ppVar14->off;
                      (puVar36 + sVar51)[0] = '\0';
                      (puVar36 + sVar51)[1] = '\0';
                      sVar51 = ppVar14->off;
                      ppVar14->off = sVar51 + 2;
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar37 = ppVar14->off;
                      (puVar36 + sVar37)[0] = '\0';
                      (puVar36 + sVar37)[1] = '\0';
                      sVar37 = ppVar14->off;
                      ppVar14->off = sVar37 + 2;
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      ppVar14->base[ppVar14->off] = '\0';
                      sVar15 = ppVar14->off;
                      sVar46 = sVar15 + 1;
                      ppVar14->off = sVar46;
                      pcVar10 = tls->negotiated_protocol;
                      sVar31 = strlen(pcVar10);
                      iVar26 = ptls_buffer__do_pushv(ppVar14,pcVar10,sVar31);
                      if ((iVar26 != 0) ||
                         (uVar41 = ppVar14->off - sVar46, iVar26 = iVar53, 0xff < uVar41))
                      goto LAB_0012065f;
                      ppVar14->base[sVar15] = (uint8_t)uVar41;
                      uVar41 = ppVar14->off - (sVar37 + 2);
                      if (0xffff < uVar41) goto LAB_0012065f;
                      ppVar14->base[sVar37] = (uint8_t)(uVar41 >> 8);
                      ppVar14->base[sVar37 + 1] = (uint8_t)uVar41;
                      uVar41 = ppVar14->off - (sVar51 + 2);
                      if (0xffff < uVar41) goto LAB_0012065f;
                      ppVar14->base[sVar51] = (uint8_t)(uVar41 >> 8);
                      ppVar14->base[sVar51 + 1] = (uint8_t)uVar41;
                    }
                    if (tls->pending_handshake_secret != (uint8_t *)0x0) {
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar51 = ppVar14->off;
                      (puVar36 + sVar51)[0] = '\0';
                      (puVar36 + sVar51)[1] = '*';
                      ppVar14->off = ppVar14->off + 2;
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar51 = ppVar14->off;
                      (puVar36 + sVar51)[0] = '\0';
                      (puVar36 + sVar51)[1] = '\0';
                      sVar51 = ppVar14->off;
                      ppVar14->off = sVar51 + 2;
                      ppVar14->base[sVar51] = '\0';
                      ppVar14->base[sVar51 + 1] = '\0';
                    }
                    if ((((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x5)
                          == (undefined1  [112])0x1) &&
                        ((tls->ctx->ech).server.create_opener != (ptls_ech_create_opener_t *)0x0))
                       && ((tls->ctx->ech).server.retry_configs.len != 0)) {
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar51 = ppVar14->off;
                      (puVar36 + sVar51)[0] = 0xfe;
                      (puVar36 + sVar51)[1] = '\r';
                      ppVar14->off = ppVar14->off + 2;
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar51 = ppVar14->off;
                      (puVar36 + sVar51)[0] = '\0';
                      (puVar36 + sVar51)[1] = '\0';
                      sVar51 = ppVar14->off;
                      ppVar14->off = sVar51 + 2;
                      iVar26 = ptls_buffer__do_pushv
                                         (ppVar14,(tls->ctx->ech).server.retry_configs.base,
                                          (tls->ctx->ech).server.retry_configs.len);
                      if ((iVar26 != 0) ||
                         (uVar41 = ppVar14->off - (sVar51 + 2), iVar26 = iVar53, 0xffff < uVar41))
                      goto LAB_0012065f;
                      ppVar14->base[sVar51] = (uint8_t)(uVar41 >> 8);
                      ppVar14->base[sVar51 + 1] = (uint8_t)uVar41;
                    }
                    if (((ch->ticket_request).new_session_count != '\0') &&
                       ((tls->field_19).server.num_tickets_to_send != '\0')) {
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar51 = ppVar14->off;
                      (puVar36 + sVar51)[0] = '\0';
                      (puVar36 + sVar51)[1] = ':';
                      ppVar14->off = ppVar14->off + 2;
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      puVar36 = ppVar14->base;
                      sVar51 = ppVar14->off;
                      (puVar36 + sVar51)[0] = '\0';
                      (puVar36 + sVar51)[1] = '\0';
                      sVar51 = ppVar14->off;
                      ppVar14->off = sVar51 + 2;
                      uVar3 = (tls->field_19).server.num_tickets_to_send;
                      iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
                      if (iVar26 != 0) goto LAB_0012065f;
                      ppVar14->base[ppVar14->off] = uVar3;
                      sVar37 = ppVar14->off + 1;
                      ppVar14->off = sVar37;
                      uVar41 = sVar37 - (sVar51 + 2);
                      iVar26 = iVar53;
                      if (0xffff < uVar41) goto LAB_0012065f;
                      ppVar14->base[sVar51] = (uint8_t)(uVar41 >> 8);
                      ppVar14->base[sVar51 + 1] = (uint8_t)uVar41;
                    }
                    iVar26 = push_additional_extensions(properties,ppVar14);
                    if ((iVar26 == 0) &&
                       (uVar41 = ppVar14->off - (sVar50 + 2), iVar26 = iVar53, uVar41 < 0x10000)) {
                      ppVar14->base[sVar50] = (uint8_t)(uVar41 >> 8);
                      ppVar14->base[sVar50 + 1] = (uint8_t)uVar41;
                      uVar41 = ppVar34->off - (local_b18 + 3);
                      if (uVar41 < 0x1000000) {
                        lVar43 = 0x10;
                        do {
                          ppVar34->base[local_b18] = (uint8_t)(uVar41 >> ((byte)lVar43 & 0x3f));
                          lVar43 = lVar43 + -8;
                          local_b18 = local_b18 + 1;
                        } while (lVar43 != -8);
                        if ((ppVar32 != (ptls_key_schedule_t *)0x0) && (ppVar32->num_hashes != 0)) {
                          puVar36 = ppVar34->base;
                          sVar50 = ppVar34->off;
                          pppVar45 = &ppVar32->hashes[0].ctx;
                          sVar51 = 0;
                          do {
                            (*(*pppVar45)->update)(*pppVar45,puVar36 + sVar30,sVar50 - sVar30);
                            sVar51 = sVar51 + 1;
                            pppVar45 = pppVar45 + 3;
                          } while (sVar51 != ppVar32->num_hashes);
                        }
                        iVar26 = (*emitter->commit_message)(emitter);
                        if (iVar26 == 0) {
                          if (iVar27 == 0) {
                            if ((tls->ctx->field_0xb8 & 8) != 0) {
                              iVar26 = (*emitter->begin_message)(emitter);
                              if (iVar26 != 0) goto LAB_0012065f;
                              ppVar34 = emitter->buf;
                              ppVar32 = tls->key_schedule;
                              sVar30 = ppVar34->off;
                              iVar26 = ptls_buffer_reserve_aligned(ppVar34,1,'\0');
                              if (iVar26 != 0) goto LAB_0012065f;
                              ppVar34->base[ppVar34->off] = '\r';
                              ppVar34->off = ppVar34->off + 1;
                              iVar26 = ptls_buffer_reserve_aligned(ppVar34,3,'\0');
                              if (iVar26 != 0) goto LAB_0012065f;
                              puVar36 = ppVar34->base;
                              sVar50 = ppVar34->off;
                              puVar36[sVar50 + 2] = '\0';
                              puVar36 = puVar36 + sVar50;
                              puVar36[0] = '\0';
                              puVar36[1] = '\0';
                              local_b00 = ppVar34->off;
                              ppVar34->off = local_b00 + 3;
                              ppVar14 = emitter->buf;
                              iVar26 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
                              if (iVar26 != 0) goto LAB_0012065f;
                              ppVar14->base[ppVar14->off] = '\0';
                              ppVar14->off = ppVar14->off + 1;
                              iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                              if (iVar26 != 0) goto LAB_0012065f;
                              puVar36 = ppVar14->base;
                              sVar50 = ppVar14->off;
                              (puVar36 + sVar50)[0] = '\0';
                              (puVar36 + sVar50)[1] = '\0';
                              sVar50 = ppVar14->off;
                              ppVar14->off = sVar50 + 2;
                              iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                              if (iVar26 != 0) goto LAB_0012065f;
                              puVar36 = ppVar14->base;
                              sVar51 = ppVar14->off;
                              (puVar36 + sVar51)[0] = '\0';
                              (puVar36 + sVar51)[1] = '\r';
                              ppVar14->off = ppVar14->off + 2;
                              iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                              if (iVar26 != 0) goto LAB_0012065f;
                              puVar36 = ppVar14->base;
                              sVar51 = ppVar14->off;
                              (puVar36 + sVar51)[0] = '\0';
                              (puVar36 + sVar51)[1] = '\0';
                              sVar51 = ppVar14->off;
                              ppVar14->off = sVar51 + 2;
                              iVar26 = push_signature_algorithms
                                                 (tls->ctx->verify_certificate,ppVar14);
                              if ((iVar26 != 0) ||
                                 (uVar41 = ppVar14->off - (sVar51 + 2), iVar26 = iVar53,
                                 0xffff < uVar41)) goto LAB_0012065f;
                              ppVar14->base[sVar51] = (uint8_t)(uVar41 >> 8);
                              ppVar14->base[sVar51 + 1] = (uint8_t)uVar41;
                              if ((tls->ctx->client_ca_names).count != 0) {
                                iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                if (iVar26 != 0) goto LAB_0012065f;
                                puVar36 = ppVar14->base;
                                sVar51 = ppVar14->off;
                                (puVar36 + sVar51)[0] = '\0';
                                (puVar36 + sVar51)[1] = '/';
                                ppVar14->off = ppVar14->off + 2;
                                iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                if (iVar26 != 0) goto LAB_0012065f;
                                puVar36 = ppVar14->base;
                                sVar51 = ppVar14->off;
                                (puVar36 + sVar51)[0] = '\0';
                                (puVar36 + sVar51)[1] = '\0';
                                sVar51 = ppVar14->off;
                                ppVar14->off = sVar51 + 2;
                                iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                if (iVar26 != 0) goto LAB_0012065f;
                                puVar36 = ppVar14->base;
                                sVar37 = ppVar14->off;
                                (puVar36 + sVar37)[0] = '\0';
                                (puVar36 + sVar37)[1] = '\0';
                                sVar15 = ppVar14->off;
                                sVar37 = sVar15 + 2;
                                ppVar14->off = sVar37;
                                sVar46 = sVar37;
                                if ((tls->ctx->client_ca_names).count != 0) {
                                  lVar43 = 8;
                                  sVar46 = 0;
                                  do {
                                    iVar26 = ptls_buffer_reserve_aligned(ppVar14,2,'\0');
                                    if (iVar26 != 0) goto LAB_0012065f;
                                    puVar36 = ppVar14->base;
                                    sVar17 = ppVar14->off;
                                    (puVar36 + sVar17)[0] = '\0';
                                    (puVar36 + sVar17)[1] = '\0';
                                    sVar17 = ppVar14->off;
                                    ppVar14->off = sVar17 + 2;
                                    ppVar52 = (tls->ctx->client_ca_names).list;
                                    iVar26 = ptls_buffer__do_pushv
                                                       (ppVar14,*(void **)((long)ppVar52 +
                                                                          lVar43 + -8),
                                                        *(size_t *)((long)&ppVar52->base + lVar43));
                                    if ((iVar26 != 0) ||
                                       (uVar41 = ppVar14->off - (sVar17 + 2), iVar26 = iVar53,
                                       0xffff < uVar41)) goto LAB_0012065f;
                                    ppVar14->base[sVar17] = (uint8_t)(uVar41 >> 8);
                                    ppVar14->base[sVar17 + 1] = (uint8_t)uVar41;
                                    sVar46 = sVar46 + 1;
                                    lVar43 = lVar43 + 0x10;
                                  } while (sVar46 != (tls->ctx->client_ca_names).count);
                                  sVar46 = ppVar14->off;
                                }
                                uVar41 = sVar46 - sVar37;
                                iVar26 = iVar53;
                                if (0xffff < uVar41) goto LAB_0012065f;
                                ppVar14->base[sVar15] = (uint8_t)(uVar41 >> 8);
                                ppVar14->base[sVar15 + 1] = (uint8_t)uVar41;
                                uVar41 = ppVar14->off - (sVar51 + 2);
                                if (0xffff < uVar41) goto LAB_0012065f;
                                ppVar14->base[sVar51] = (uint8_t)(uVar41 >> 8);
                                ppVar14->base[sVar51 + 1] = (uint8_t)uVar41;
                              }
                              uVar41 = ppVar14->off - (sVar50 + 2);
                              iVar26 = iVar53;
                              if (0xffff < uVar41) goto LAB_0012065f;
                              ppVar14->base[sVar50] = (uint8_t)(uVar41 >> 8);
                              ppVar14->base[sVar50 + 1] = (uint8_t)uVar41;
                              uVar41 = ppVar34->off - (local_b00 + 3);
                              iVar26 = 0x20c;
                              if (0xffffff < uVar41) goto LAB_0012065f;
                              lVar43 = 0x10;
                              do {
                                ppVar34->base[local_b00] =
                                     (uint8_t)(uVar41 >> ((byte)lVar43 & 0x3f));
                                lVar43 = lVar43 + -8;
                                local_b00 = local_b00 + 1;
                              } while (lVar43 != -8);
                              if ((ppVar32 != (ptls_key_schedule_t *)0x0) &&
                                 (ppVar32->num_hashes != 0)) {
                                puVar36 = ppVar34->base;
                                sVar50 = ppVar34->off;
                                pppVar45 = &ppVar32->hashes[0].ctx;
                                sVar51 = 0;
                                do {
                                  (*(*pppVar45)->update)(*pppVar45,puVar36 + sVar30,sVar50 - sVar30)
                                  ;
                                  sVar51 = sVar51 + 1;
                                  pppVar45 = pppVar45 + 3;
                                } while (sVar51 != ppVar32->num_hashes);
                              }
                              iVar26 = (*emitter->commit_message)(emitter);
                              if (iVar26 != 0) goto LAB_0012065f;
                            }
                            iVar26 = send_certificate(tls,emitter,
                                                      (st_ptls_signature_algorithms_t *)
                                                      (ch->signature_algorithms).count,
                                                      (ptls_iovec_t)ZEXT816(0),
                                                      (byte)ch->field_0x228 & 1,
                                                      (ch->cert_compression_algos).list,
                                                      (ch->cert_compression_algos).count);
                            if (iVar26 == 0) {
                              iVar26 = server_finish_handshake
                                                 (tls,emitter,1,&ch->signature_algorithms);
                            }
                          }
                          else {
                            iVar26 = server_finish_handshake
                                               (tls,emitter,0,(st_ptls_signature_algorithms_t *)0x0)
                            ;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0012065f:
  free(local_aa8.base);
  if (local_ab8.base != (uint8_t *)0x0) {
    (*ptls_clear_memory)(local_ab8.base,local_ab8.len);
    free(local_ab8.base);
  }
  free(local_a68);
  free(pvStack_a60);
  puVar36 = local_a58.base;
  (*ptls_clear_memory)(local_a58.base,local_a58.off);
  if (local_a58.is_allocated != '\0') {
    free(puVar36);
  }
  free(ch);
  return iVar26;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions, post_action)                                                               \
    do {                                                                                                                           \
        size_t sh_start_off;                                                                                                       \
        ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                       \
            sh_start_off = emitter->buf->off - PTLS_HANDSHAKE_HEADER_SIZE;                                                         \
            ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                         \
            if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                            \
                goto Exit;                                                                                                         \
            do {                                                                                                                   \
                fill_rand                                                                                                          \
            } while (0);                                                                                                           \
            emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                           \
            ptls_buffer_push_block(emitter->buf, 1,                                                                                \
                                   { ptls_buffer_pushv(emitter->buf, ch->legacy_session_id.base, ch->legacy_session_id.len); });   \
            ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                               \
            ptls_buffer_push(emitter->buf, 0);                                                                                     \
            ptls_buffer_push_block(emitter->buf, 2, {                                                                              \
                buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                        \
                                      { ptls_buffer_push16(emitter->buf, ch->selected_version); });                                \
                do {                                                                                                               \
                    extensions                                                                                                     \
                } while (0);                                                                                                       \
            });                                                                                                                    \
        }